

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

ScalarFunctionSet * duckdb::OperatorSubtractFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *pvVar1;
  ScalarFunctionSet *in_RDI;
  element_type *type;
  element_type *local_d50;
  element_type *local_d48;
  LogicalType local_d38;
  ScalarFunctionSet *local_d20;
  _Any_data *local_d18;
  element_type *local_d10;
  string local_d08;
  ScalarFunction local_ce8;
  ScalarFunction local_bc0;
  ScalarFunction local_a98;
  ScalarFunction local_970;
  ScalarFunction local_848;
  ScalarFunction local_720;
  ScalarFunction local_5f8;
  ScalarFunction local_4d0;
  ScalarFunction local_3a8;
  ScalarFunction local_280;
  ScalarFunction local_158;
  
  local_d08._M_dataplus._M_p = (pointer)&local_d08.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d08,"-","");
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_d08);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d08._M_dataplus._M_p != &local_d08.field_2) {
    operator_delete(local_d08._M_dataplus._M_p);
  }
  local_d20 = in_RDI;
  LogicalType::Numeric();
  local_d10 = local_d48;
  if (local_d50 != local_d48) {
    pvVar1 = &(local_d20->super_FunctionSet<duckdb::ScalarFunction>).functions;
    local_d18 = (_Any_data *)&local_158.function;
    type = local_d50;
    do {
      SubtractFunction::GetFunction(&local_158,(LogicalType *)type);
      ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
      emplace_back<duckdb::ScalarFunction>
                (&pvVar1->
                  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                 &local_158);
      local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__ScalarFunction_01993078;
      if (local_158.function_info.internal.
          super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_158.function_info.internal.
                   super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_158.function.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_158.function.super__Function_base._M_manager)(local_d18,local_d18,__destroy_functor)
        ;
      }
      BaseScalarFunction::~BaseScalarFunction(&local_158.super_BaseScalarFunction);
      SubtractFunction::GetFunction(&local_280,(LogicalType *)type,(LogicalType *)type);
      ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
      emplace_back<duckdb::ScalarFunction>
                (&pvVar1->
                  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                 &local_280);
      local_280.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__ScalarFunction_01993078;
      if (local_280.function_info.internal.
          super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_280.function_info.internal.
                   super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_280.function.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_280.function.super__Function_base._M_manager)
                  ((_Any_data *)&local_280.function,(_Any_data *)&local_280.function,
                   __destroy_functor);
      }
      BaseScalarFunction::~BaseScalarFunction(&local_280.super_BaseScalarFunction);
      type = (element_type *)&(type->alias)._M_string_length;
    } while (type != local_d10);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_d50);
  LogicalType::LogicalType((LogicalType *)&local_d50,DATE);
  LogicalType::LogicalType(&local_d38,DATE);
  SubtractFunction::GetFunction(&local_3a8,(LogicalType *)&local_d50,&local_d38);
  pvVar1 = &(local_d20->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&pvVar1->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_3a8);
  local_3a8.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01993078;
  if (local_3a8.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3a8.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_3a8.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3a8.function.super__Function_base._M_manager)
              ((_Any_data *)&local_3a8.function,(_Any_data *)&local_3a8.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_3a8.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_d38);
  LogicalType::~LogicalType((LogicalType *)&local_d50);
  LogicalType::LogicalType((LogicalType *)&local_d50,DATE);
  LogicalType::LogicalType(&local_d38,INTEGER);
  SubtractFunction::GetFunction(&local_4d0,(LogicalType *)&local_d50,&local_d38);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&pvVar1->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_4d0);
  local_4d0.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01993078;
  if (local_4d0.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_4d0.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_4d0.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4d0.function.super__Function_base._M_manager)
              ((_Any_data *)&local_4d0.function,(_Any_data *)&local_4d0.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_4d0.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_d38);
  LogicalType::~LogicalType((LogicalType *)&local_d50);
  LogicalType::LogicalType((LogicalType *)&local_d50,TIMESTAMP);
  LogicalType::LogicalType(&local_d38,TIMESTAMP);
  SubtractFunction::GetFunction(&local_5f8,(LogicalType *)&local_d50,&local_d38);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&pvVar1->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_5f8);
  local_5f8.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01993078;
  if (local_5f8.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5f8.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_5f8.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_5f8.function.super__Function_base._M_manager)
              ((_Any_data *)&local_5f8.function,(_Any_data *)&local_5f8.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_5f8.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_d38);
  LogicalType::~LogicalType((LogicalType *)&local_d50);
  LogicalType::LogicalType((LogicalType *)&local_d50,INTERVAL);
  LogicalType::LogicalType(&local_d38,INTERVAL);
  SubtractFunction::GetFunction(&local_720,(LogicalType *)&local_d50,&local_d38);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&pvVar1->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_720);
  local_720.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01993078;
  if (local_720.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_720.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_720.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_720.function.super__Function_base._M_manager)
              ((_Any_data *)&local_720.function,(_Any_data *)&local_720.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_720.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_d38);
  LogicalType::~LogicalType((LogicalType *)&local_d50);
  LogicalType::LogicalType((LogicalType *)&local_d50,DATE);
  LogicalType::LogicalType(&local_d38,INTERVAL);
  SubtractFunction::GetFunction(&local_848,(LogicalType *)&local_d50,&local_d38);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&pvVar1->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_848);
  local_848.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01993078;
  if (local_848.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_848.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_848.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_848.function.super__Function_base._M_manager)
              ((_Any_data *)&local_848.function,(_Any_data *)&local_848.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_848.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_d38);
  LogicalType::~LogicalType((LogicalType *)&local_d50);
  LogicalType::LogicalType((LogicalType *)&local_d50,TIME);
  LogicalType::LogicalType(&local_d38,INTERVAL);
  SubtractFunction::GetFunction(&local_970,(LogicalType *)&local_d50,&local_d38);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&pvVar1->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_970);
  local_970.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01993078;
  if (local_970.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_970.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_970.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_970.function.super__Function_base._M_manager)
              ((_Any_data *)&local_970.function,(_Any_data *)&local_970.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_970.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_d38);
  LogicalType::~LogicalType((LogicalType *)&local_d50);
  LogicalType::LogicalType((LogicalType *)&local_d50,TIMESTAMP);
  LogicalType::LogicalType(&local_d38,INTERVAL);
  SubtractFunction::GetFunction(&local_a98,(LogicalType *)&local_d50,&local_d38);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&pvVar1->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_a98);
  local_a98.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01993078;
  if (local_a98.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a98.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_a98.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_a98.function.super__Function_base._M_manager)
              ((_Any_data *)&local_a98.function,(_Any_data *)&local_a98.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_a98.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_d38);
  LogicalType::~LogicalType((LogicalType *)&local_d50);
  LogicalType::LogicalType((LogicalType *)&local_d50,TIME_TZ);
  LogicalType::LogicalType(&local_d38,INTERVAL);
  SubtractFunction::GetFunction(&local_bc0,(LogicalType *)&local_d50,&local_d38);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&pvVar1->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_bc0);
  local_bc0.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01993078;
  if (local_bc0.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_bc0.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_bc0.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_bc0.function.super__Function_base._M_manager)
              ((_Any_data *)&local_bc0.function,(_Any_data *)&local_bc0.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_bc0.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_d38);
  LogicalType::~LogicalType((LogicalType *)&local_d50);
  LogicalType::LogicalType((LogicalType *)&local_d50,INTERVAL);
  SubtractFunction::GetFunction(&local_ce8,(LogicalType *)&local_d50);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&pvVar1->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_ce8);
  local_ce8.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01993078;
  if (local_ce8.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_ce8.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_ce8.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_ce8.function.super__Function_base._M_manager)
              ((_Any_data *)&local_ce8.function,(_Any_data *)&local_ce8.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_ce8.super_BaseScalarFunction);
  LogicalType::~LogicalType((LogicalType *)&local_d50);
  return local_d20;
}

Assistant:

ScalarFunctionSet OperatorSubtractFun::GetFunctions() {
	ScalarFunctionSet subtract("-");
	for (auto &type : LogicalType::Numeric()) {
		// unary subtract function, negates the input (i.e. multiplies by -1)
		subtract.AddFunction(SubtractFunction::GetFunction(type));
		// binary subtract function "a - b", subtracts b from a
		subtract.AddFunction(SubtractFunction::GetFunction(type, type));
	}
	// we can subtract dates from each other
	subtract.AddFunction(SubtractFunction::GetFunction(LogicalType::DATE, LogicalType::DATE));
	// we can subtract integers from dates
	subtract.AddFunction(SubtractFunction::GetFunction(LogicalType::DATE, LogicalType::INTEGER));
	// we can subtract timestamps from each other
	subtract.AddFunction(SubtractFunction::GetFunction(LogicalType::TIMESTAMP, LogicalType::TIMESTAMP));
	// we can subtract intervals from each other
	subtract.AddFunction(SubtractFunction::GetFunction(LogicalType::INTERVAL, LogicalType::INTERVAL));
	// we can subtract intervals from dates/times/timestamps, but not the other way around
	subtract.AddFunction(SubtractFunction::GetFunction(LogicalType::DATE, LogicalType::INTERVAL));
	subtract.AddFunction(SubtractFunction::GetFunction(LogicalType::TIME, LogicalType::INTERVAL));
	subtract.AddFunction(SubtractFunction::GetFunction(LogicalType::TIMESTAMP, LogicalType::INTERVAL));
	subtract.AddFunction(SubtractFunction::GetFunction(LogicalType::TIME_TZ, LogicalType::INTERVAL));
	// we can negate intervals
	subtract.AddFunction(SubtractFunction::GetFunction(LogicalType::INTERVAL));

	return subtract;
}